

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O3

void __thiscall AsyncRgbLedAnalyzer::AsyncRgbLedAnalyzer(AsyncRgbLedAnalyzer *this)

{
  AsyncRgbLedAnalyzerSettings *this_00;
  
  Analyzer2::Analyzer2(&this->super_Analyzer2);
  *(undefined ***)this = &PTR__AsyncRgbLedAnalyzer_0010dc90;
  this_00 = (AsyncRgbLedAnalyzerSettings *)operator_new(0x50);
  AsyncRgbLedAnalyzerSettings::AsyncRgbLedAnalyzerSettings(this_00);
  (this->mSettings)._M_t.
  super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
  ._M_t.
  super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
  .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl = this_00;
  (this->mResults)._M_t.
  super___uniq_ptr_impl<AsyncRgbLedAnalyzerResults,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
  ._M_t.
  super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerResults_*,_std::default_delete<AsyncRgbLedAnalyzerResults>_>
  .super__Head_base<0UL,_AsyncRgbLedAnalyzerResults_*,_false>._M_head_impl =
       (AsyncRgbLedAnalyzerResults *)0x0;
  this->mChannelData = (AnalyzerChannelData *)0x0;
  AsyncRgbLedSimulationDataGenerator::AsyncRgbLedSimulationDataGenerator
            (&this->mSimulationDataGenerator);
  this->mSimulationInitialized = false;
  this->mSampleRateHz = 0.0;
  this->mMinimumLowDurationSec = 0.0;
  this->mFirstBitAfterReset = false;
  this->mDidDetectHighSpeed = false;
  Analyzer::SetAnalyzerSettings((AnalyzerSettings *)this);
  Analyzer::UseFrameV2();
  return;
}

Assistant:

AsyncRgbLedAnalyzer::AsyncRgbLedAnalyzer() : Analyzer2(), mSettings( new AsyncRgbLedAnalyzerSettings )
{
    SetAnalyzerSettings( mSettings.get() );
    UseFrameV2();
}